

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O1

int get_item_for_cursor(coda_tree_node *node,int depth,coda_cursor *cursor,void **item)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (node == (coda_tree_node *)0x0) {
LAB_00161ef0:
    pvVar4 = (void *)0x0;
  }
  else {
    if (depth < cursor->n + -1) {
      if (0 < node->num_indexed_children) {
        uVar2 = node->num_indexed_children - 1;
        uVar5 = (ulong)uVar2;
        lVar1 = cursor->stack[depth + 1].index;
        if (uVar2 != 0) {
          uVar6 = 0;
          uVar3 = uVar5;
          do {
            uVar5 = (long)(uVar6 + uVar3) / 2;
            if (node->index[uVar5] < lVar1) {
              uVar6 = uVar5 + 1;
              uVar5 = uVar3;
            }
            uVar3 = uVar5;
          } while (uVar5 != uVar6);
        }
        if (lVar1 == node->index[uVar5]) {
          uVar2 = get_item_for_cursor(node->indexed_child[uVar5],depth + 1,cursor,item);
          pvVar4 = (void *)(ulong)uVar2;
          if (item != (void **)0x0) goto LAB_00161ef5;
        }
      }
      if (node->all_children != (coda_tree_node *)0x0) {
        uVar2 = get_item_for_cursor(node->all_children,depth + 1,cursor,item);
        pvVar4 = (void *)(ulong)uVar2;
        if (item != (void **)0x0) goto LAB_00161ef5;
      }
      goto LAB_00161ef0;
    }
    if ((long)node->num_items < 1) goto LAB_00161ef0;
    pvVar4 = node->item[(long)node->num_items + -1];
  }
  *item = pvVar4;
LAB_00161ef5:
  return (int)pvVar4;
}

Assistant:

static int get_item_for_cursor(coda_tree_node *node, int depth, coda_cursor *cursor, void **item)
{
    if (node == NULL)
    {
        *item = NULL;
        return 0;
    }

    if (depth < cursor->n - 1)
    {
        /* specific indexed array elements take precedence over an 'all array elements' reference */
        if (node->num_indexed_children > 0)
        {
            long bottom = 0;
            long top = node->num_indexed_children - 1;
            long index = cursor->stack[depth + 1].index;

            while (top != bottom)
            {
                long middle = (bottom + top) / 2;

                if (index <= node->index[middle])
                {
                    top = middle;
                }
                if (index > node->index[middle])
                {
                    bottom = middle + 1;
                }
            }
            if (index == node->index[top])
            {
                if (get_item_for_cursor(node->indexed_child[top], depth + 1, cursor, item) != 0)
                {
                    return -1;
                }
                if (item != NULL)
                {
                    return 0;
                }
            }
        }
        if (node->all_children != NULL)
        {
            if (get_item_for_cursor(node->all_children, depth + 1, cursor, item) != 0)
            {
                return -1;
            }
            if (item != NULL)
            {
                return 0;
            }
        }
    }
    else if (node->num_items > 0)
    {
        /* return the last item in the list */
        *item = node->item[node->num_items - 1];
        return 0;
    }

    /* nothing found */
    *item = NULL;
    return 0;
}